

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks,bool bCreateIfNull)

{
  int iVar1;
  undefined4 extraout_var;
  pointer ppEVar2;
  EbmlElement *pEVar3;
  pointer ppEVar4;
  ulong uVar5;
  EbmlElement *local_30;
  
  ppEVar2 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar2) {
    uVar5 = 0;
    do {
      if (ppEVar2[uVar5] != (EbmlElement *)0x0) {
        iVar1 = (*ppEVar2[uVar5]->_vptr_EbmlElement[3])();
        if ((Callbacks->GlobalId->Length == *(size_t *)((uint32 *)CONCAT44(extraout_var,iVar1) + 2))
           && (Callbacks->GlobalId->Value == *(uint32 *)CONCAT44(extraout_var,iVar1))) {
          return (this->ElementList).
                 super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5];
        }
        ppEVar2 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppEVar4 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppEVar4 - (long)ppEVar2 >> 3));
  }
  if (bCreateIfNull) {
    pEVar3 = (*Callbacks->Create)();
    local_30 = pEVar3;
    std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
    emplace_back<libebml::EbmlElement*>
              ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
               &this->ElementList,&local_30);
  }
  else {
    pEVar3 = (EbmlElement *)0x0;
  }
  return pEVar3;
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (ElementList[Index] && EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}